

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O0

ktx_error_code_e
ktxTexture2_WriteToMemory(ktxTexture2 *This,ktx_uint8_t **ppDstBytes,ktx_size_t *pSize)

{
  long *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  ktx_size_t strSize;
  ktx_error_code_e result;
  ktxStream dststr;
  ktxStream *in_stack_000000f0;
  ktxTexture2 *in_stack_000000f8;
  int iVar1;
  ktxStream *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff74;
  ktxStream *in_stack_ffffffffffffff78;
  code *local_60;
  ktx_error_code_e local_4;
  
  if (((in_RDI == 0) || (in_RSI == (undefined8 *)0x0)) || (in_RDX == (long *)0x0)) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    *in_RSI = 0;
    local_4 = ktxMemStream_construct
                        (in_stack_ffffffffffffff78,SUB41((uint)in_stack_ffffffffffffff74 >> 0x18,0))
    ;
    if (local_4 == KTX_SUCCESS) {
      local_4 = ktxTexture2_WriteToStream(in_stack_000000f8,in_stack_000000f0);
      if (local_4 == KTX_SUCCESS) {
        ktxMemStream_getdata(in_stack_ffffffffffffff68,(ktx_uint8_t **)0x541b33);
        iVar1 = (int)in_stack_ffffffffffffff68;
        (*local_60)(&stack0xffffffffffffff78,&stack0xffffffffffffff68);
        *in_RDX = (long)iVar1;
        ktxMemStream_destruct((ktxStream *)0x541b58);
        local_4 = KTX_SUCCESS;
      }
      else {
        ktxMemStream_destruct((ktxStream *)0x541b14);
      }
    }
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxTexture2_WriteToMemory(ktxTexture2* This,
                          ktx_uint8_t** ppDstBytes, ktx_size_t* pSize)
{
    struct ktxStream dststr;
    KTX_error_code result;
    ktx_size_t strSize;

    if (!This || !ppDstBytes || !pSize)
        return KTX_INVALID_VALUE;

    *ppDstBytes = NULL;

    result = ktxMemStream_construct(&dststr, KTX_FALSE);
    if (result != KTX_SUCCESS)
        return result;

    result = ktxTexture2_WriteToStream(This, &dststr);
    if(result != KTX_SUCCESS)
    {
        ktxMemStream_destruct(&dststr);
        return result;
    }

    ktxMemStream_getdata(&dststr, ppDstBytes);
    dststr.getsize(&dststr, &strSize);
    *pSize = (GLsizei)strSize;
    /* This function does not free the memory pointed at by the
     * value obtained from ktxMemStream_getdata() thanks to the
     * KTX_FALSE passed to the constructor above.
     */
    ktxMemStream_destruct(&dststr);
    return KTX_SUCCESS;

}